

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

void __thiscall FCompileContext::HandleJumps(FCompileContext *this,int token,FxExpression *handler)

{
  uint uVar1;
  FxJumpStatement **ppFVar2;
  uint local_24;
  uint i;
  FxExpression *handler_local;
  int token_local;
  FCompileContext *this_local;
  
  local_24 = 0;
  while( true ) {
    uVar1 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::Size(&this->Jumps);
    if (uVar1 <= local_24) break;
    ppFVar2 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[](&this->Jumps,(ulong)local_24)
    ;
    if (*(int *)&((*ppFVar2)->super_FxExpression).field_0x34 == token) {
      ppFVar2 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[]
                          (&this->Jumps,(ulong)local_24);
      (*ppFVar2)->AddressResolver = handler;
      ppFVar2 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[]
                          (&this->Jumps,(ulong)local_24);
      TArray<FxJumpStatement_*,_FxJumpStatement_*>::Push(&handler->JumpAddresses,ppFVar2);
      TArray<FxJumpStatement_*,_FxJumpStatement_*>::Delete(&this->Jumps,local_24);
      local_24 = local_24 - 1;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void FCompileContext::HandleJumps(int token, FxExpression *handler)
{
	for (unsigned int i = 0; i < Jumps.Size(); i++)
	{
		if (Jumps[i]->Token == token)
		{
			Jumps[i]->AddressResolver = handler;
			handler->JumpAddresses.Push(Jumps[i]);
			Jumps.Delete(i);
			i--;
		}
	}
}